

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O0

void __thiscall x86Argument::x86Argument(x86Argument *this,x86Size size,x86Reg regA,uint num)

{
  uint num_local;
  x86Reg regA_local;
  x86Size size_local;
  x86Argument *this_local;
  
  this->type = argPtr;
  (this->field_1).ptrSize = size;
  this->ptrBase = regA;
  this->ptrIndex = rNONE;
  this->ptrMult = 1;
  this->ptrNum = num;
  return;
}

Assistant:

x86Argument(x86Size size, x86Reg regA, unsigned num)
	{
		this->type = argPtr;
		this->ptrSize = size;
		this->ptrBase = regA;
		this->ptrIndex = rNONE;
		this->ptrMult = 1;
		this->ptrNum = num;
	}